

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::SimplePolygonMesh::readMeshFromObjFile
          (SimplePolygonMesh *this,istream *in)

{
  value_type *__n;
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  reference puVar4;
  value_type *pvVar5;
  istream *in_RSI;
  size_t i_1;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *faceCoord;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *faceCoordInd;
  iterator __end3;
  iterator __begin3;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__range3;
  size_t i;
  Index index;
  vector<unsigned_long,_std::allocator<unsigned_long>_> faceCoordInds;
  vector<unsigned_long,_std::allocator<unsigned_long>_> face;
  double v;
  double u;
  Vector3 position;
  string token;
  stringstream ss;
  string line;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  polygonCoordInds;
  vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> coords;
  value_type *in_stack_fffffffffffffc68;
  SimplePolygonMesh *in_stack_fffffffffffffc70;
  value_type *in_stack_fffffffffffffc78;
  value_type *__x;
  vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
  *in_stack_fffffffffffffc80;
  undefined6 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9e;
  undefined1 in_stack_fffffffffffffc9f;
  istream *in_stack_fffffffffffffca0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_320;
  reference local_318;
  SimplePolygonMesh *local_310;
  reference local_308;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_300;
  __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_2f8;
  undefined1 *local_2f0;
  long local_2e8;
  long local_2e0;
  string local_2d8 [32];
  long local_2b8;
  long local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  long local_298;
  long local_290;
  undefined8 local_288;
  double local_250;
  double local_248;
  double local_240;
  double local_238 [4];
  string local_218 [32];
  stringstream local_1f8 [408];
  vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> local_60;
  undefined1 local_40 [32];
  string *in_stack_ffffffffffffffe0;
  
  clear(in_stack_fffffffffffffc70);
  ::std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::vector
            ((vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *)0x272da6
            );
  ::std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x272db3);
  ::std::__cxx11::string::string((string *)&local_60);
  while( true ) {
    piVar3 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (in_RSI,(string *)&local_60);
    bVar1 = ::std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    _Var2 = std::operator|(_S_out,_S_in);
    ::std::__cxx11::stringstream::stringstream(local_1f8,(string *)&local_60,_Var2);
    ::std::__cxx11::string::string(local_218);
    ::std::operator>>((istream *)local_1f8,local_218);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    if (bVar1) {
      operator>>(in_stack_fffffffffffffca0,
                 (Vector3 *)
                 CONCAT17(in_stack_fffffffffffffc9f,
                          CONCAT16(in_stack_fffffffffffffc9e,in_stack_fffffffffffffc98)));
      ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::push_back
                ((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
                 in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
      if (bVar1) {
        in_stack_fffffffffffffca0 = (istream *)::std::istream::operator>>(local_1f8,local_238);
        ::std::istream::operator>>(in_stack_fffffffffffffca0,&local_240);
        local_250 = local_238[0];
        local_248 = local_240;
        std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::push_back
                  ((vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *)
                   in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      }
      else {
        in_stack_fffffffffffffc9f =
             ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
        if ((!(bool)in_stack_fffffffffffffc9f) &&
           (in_stack_fffffffffffffc9e =
                 ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68),
           (bool)in_stack_fffffffffffffc9e)) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x272fd4);
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x272fe1);
          while( true ) {
            piVar3 = ::std::operator>>((istream *)local_1f8,local_218);
            bVar1 = ::std::ios::operator_cast_to_bool
                              ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
            if (!bVar1) break;
            anon_unknown_0::parseFaceIndex(in_stack_ffffffffffffffe0);
            if (local_298 < 0) {
              ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                        (in_RSI,(string *)&local_60);
              in_stack_fffffffffffffc80 = &local_60;
              local_2a0 = ::std::__cxx11::string::find_first_not_of
                                    ((char *)in_stack_fffffffffffffc80,0x4db780);
              ::std::__cxx11::string::substr((ulong)local_2d8,(ulong)in_stack_fffffffffffffc80);
              anon_unknown_0::parseFaceIndex(in_stack_ffffffffffffffe0);
              local_298 = local_2b8;
              local_290 = local_2b0;
              local_288 = local_2a8;
              ::std::__cxx11::string::~string(local_2d8);
            }
            local_2e0 = local_298;
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffc70,(value_type_conflict *)in_stack_fffffffffffffc68);
            if (local_290 != -1) {
              local_2e8 = local_290;
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffc70,(value_type_conflict *)in_stack_fffffffffffffc68)
              ;
            }
          }
          ::std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
          bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffc80);
          if (!bVar1) {
            ::std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
          }
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc80);
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc80);
        }
      }
    }
    ::std::__cxx11::string::~string(local_218);
    ::std::__cxx11::stringstream::~stringstream(local_1f8);
  }
  bVar1 = ::std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::empty((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)in_stack_fffffffffffffc80);
  if (!bVar1) {
    local_2f0 = local_40;
    local_2f8._M_current =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         ::std::
         vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ::begin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)in_stack_fffffffffffffc68);
    local_300 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                ::std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::end((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)in_stack_fffffffffffffc68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                               *)in_stack_fffffffffffffc70,
                              (__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                               *)in_stack_fffffffffffffc68), bVar1) {
      local_308 = __gnu_cxx::
                  __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::operator*(&local_2f8);
      std::
      vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
      ::emplace_back<>((vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                        *)in_stack_fffffffffffffc70);
      local_310 = (SimplePolygonMesh *)
                  std::
                  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                  ::back((vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                          *)in_stack_fffffffffffffc70);
      local_318 = local_308;
      local_320._M_current =
           (unsigned_long *)
           ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffc68);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc68)
      ;
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffc70,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffc68), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_320);
        __n = (value_type *)*puVar4;
        __x = __n;
        pvVar5 = (value_type *)
                 ::std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                 ::size((vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                         *)(local_40 + 0x18));
        if (__x < pvVar5) {
          in_stack_fffffffffffffc70 = local_310;
          ::std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::
          operator[]((vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *)
                     (local_40 + 0x18),(size_type)__n);
          std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::
          push_back(in_stack_fffffffffffffc80,__x);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_320);
      }
      __gnu_cxx::
      __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator++(&local_2f8);
    }
  }
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)in_stack_fffffffffffffc80);
  ::std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::~vector
            (in_stack_fffffffffffffc80);
  return;
}

Assistant:

void SimplePolygonMesh::readMeshFromObjFile(std::istream& in) {
  clear();

  // corner UV coords, unpacked below
  std::vector<Vector2> coords;
  std::vector<std::vector<size_t>> polygonCoordInds;

  // parse obj format
  std::string line;
  while (getline(in, line)) {
    std::stringstream ss(line);
    std::string token;

    ss >> token;

    if (token == "v") {
      Vector3 position;
      ss >> position;

      vertexCoordinates.push_back(position);

    } else if (token == "vt") {
      double u, v;
      ss >> u >> v;

      coords.push_back(Vector2{u, v});

    } else if (token == "vn") {
      // Do nothing

    } else if (token == "f") {
      std::vector<size_t> face;
      std::vector<size_t> faceCoordInds;
      while (ss >> token) {
        Index index = parseFaceIndex(token);
        if (index.position < 0) {
          getline(in, line);
          size_t i = line.find_first_not_of("\t\n\v\f\r ");
          index = parseFaceIndex(line.substr(i));
        }

        face.push_back(index.position);

        if (index.uv != -1) {
          faceCoordInds.push_back(index.uv);
        }
      }

      polygons.push_back(face);
      if (!faceCoordInds.empty()) {
        polygonCoordInds.push_back(faceCoordInds);
      }
    }
  }

  // If we got uv coords, unpack them in to per-corner values
  if (!polygonCoordInds.empty()) {
    for (std::vector<size_t>& faceCoordInd : polygonCoordInds) {
      paramCoordinates.emplace_back();
      std::vector<Vector2>& faceCoord = paramCoordinates.back();
      for (size_t i : faceCoordInd) {
        if (i < coords.size()) faceCoord.push_back(coords[i]);
      }
    }
  }
}